

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void ustring_suite::test_empty(void)

{
  uchar input [3];
  udecoder_type decoder;
  undefined4 local_188;
  value_type_conflict local_184 [4];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_180;
  basic_decoder<unsigned_char> local_160;
  
  local_184[2] = '\0';
  local_184[0] = '\"';
  local_184[1] = '\"';
  trial::protocol::json::detail::basic_decoder<unsigned_char>::basic_decoder<3ul>
            (&local_160,(value_type_conflict (*) [3])local_184);
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_188 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73d,"void ustring_suite::test_empty()",&local_180,&local_188);
  trial::protocol::json::detail::basic_decoder<unsigned_char>::
  string_value<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_180,&local_160);
  boost::detail::test_impl
            ("decoder.string_value<ustring_type>().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73e,"void ustring_suite::test_empty()",local_180._M_string_length == 0);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&local_180);
  local_180._M_dataplus._M_p = local_160.current.view.tail + -(long)local_160.current.view.head;
  local_188 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.literal().size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73f,"void ustring_suite::test_empty()",&local_180,&local_188);
  local_188._0_1_ = 0x22;
  local_180._M_dataplus._M_p._0_1_ = *local_160.current.view.head;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,char>
            ("decoder.literal()[0]","\'\"\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x740,"void ustring_suite::test_empty()",&local_180,&local_188);
  local_180._M_dataplus._M_p._0_1_ = local_160.current.view.head[1];
  local_188 = CONCAT31(local_188._1_3_,0x22);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,char>
            ("decoder.literal()[1]","\'\"\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x741,"void ustring_suite::test_empty()",&local_180,&local_188);
  trial::protocol::json::detail::basic_decoder<unsigned_char>::next(&local_160);
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_188 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x743,"void ustring_suite::test_empty()",&local_180,&local_188);
  return;
}

Assistant:

void test_empty()
{
    const unsigned char input[] = { '"', '"', 0 };
    udecoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST(decoder.string_value<ustring_type>().empty());
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal().size(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal()[0], '"');
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal()[1], '"');
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}